

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O2

bool __thiscall RTIMULSM9DS1::setAccelCTRL6(RTIMULSM9DS1 *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  RTIMUSettings *this_00;
  bool bVar4;
  ulong uVar5;
  char *__format;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS1AccelSampleRate;
  uVar5 = (ulong)uVar1;
  if (uVar1 < 7) {
    uVar2 = this_00->m_LSM9DS1AccelLpf;
    if (uVar2 < 4) {
      uVar3 = this_00->m_LSM9DS1AccelFsr;
      uVar5 = (ulong)uVar3;
      if (uVar5 < 4) {
        this->m_accelScale = *(RTFLOAT *)(&DAT_00120740 + uVar5 * 4);
        bVar4 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_accelGyroSlaveAddr,' ',
                                   (char)uVar1 * ' ' + (char)uVar3 * '\b' | (byte)uVar2,
                                   "Failed to set LSM9DS1 accel CTRL6");
        return bVar4;
      }
      __format = "Illegal LSM9DS1 accel FSR code %d\n";
    }
    else {
      __format = "Illegal LSM9DS1 accel low pass fiter code %d\n";
      uVar5 = (ulong)uVar2;
    }
  }
  else {
    __format = "Illegal LSM9DS1 accel sample rate code %d\n";
  }
  fprintf(_stderr,__format,uVar5);
  return false;
}

Assistant:

bool RTIMULSM9DS1::setAccelCTRL6()
{
    unsigned char ctrl6;

    if ((m_settings->m_LSM9DS1AccelSampleRate < 0) || (m_settings->m_LSM9DS1AccelSampleRate > 6)) {
        HAL_ERROR1("Illegal LSM9DS1 accel sample rate code %d\n", m_settings->m_LSM9DS1AccelSampleRate);
        return false;
    }

    ctrl6 = (m_settings->m_LSM9DS1AccelSampleRate << 5);

    if ((m_settings->m_LSM9DS1AccelLpf < 0) || (m_settings->m_LSM9DS1AccelLpf > 3)) {
        HAL_ERROR1("Illegal LSM9DS1 accel low pass fiter code %d\n", m_settings->m_LSM9DS1AccelLpf);
        return false;
    }

    switch (m_settings->m_LSM9DS1AccelFsr) {
    case LSM9DS1_ACCEL_FSR_2:
        m_accelScale = (RTFLOAT)0.000061;
        break;

    case LSM9DS1_ACCEL_FSR_4:
        m_accelScale = (RTFLOAT)0.000122;
        break;

    case LSM9DS1_ACCEL_FSR_8:
        m_accelScale = (RTFLOAT)0.000244;
        break;

    case LSM9DS1_ACCEL_FSR_16:
        m_accelScale = (RTFLOAT)0.000732;
        break;

    default:
        HAL_ERROR1("Illegal LSM9DS1 accel FSR code %d\n", m_settings->m_LSM9DS1AccelFsr);
        return false;
    }

    ctrl6 |= (m_settings->m_LSM9DS1AccelLpf) | (m_settings->m_LSM9DS1AccelFsr << 3);

    return m_settings->HALWrite(m_accelGyroSlaveAddr,  LSM9DS1_CTRL6, ctrl6, "Failed to set LSM9DS1 accel CTRL6");
}